

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O3

uint * calculate_syndrome(uint *c1,uint c_len,uint t,uint *new_len)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar2 = t * 2;
  if (new_len != (uint *)0x0) {
    *new_len = uVar2;
  }
  puVar3 = (uint *)calloc((ulong)uVar2,4);
  if (uVar2 != 0) {
    uVar4 = 1;
    do {
      puVar3[uVar4 - 1] = 0;
      if (c_len != 0) {
        uVar5 = 0;
        uVar7 = 0;
        uVar6 = 0;
        do {
          uVar8 = 0;
          if ((ulong)c1[uVar7] != 0) {
            uVar8 = 0;
            if (alpha_of[uVar5 & 0xff] != 0) {
              uVar8 = index_of[alpha_of[uVar5 & 0xff]] + index_of[c1[uVar7]];
              uVar1 = (index_of[alpha_of[uVar5 & 0xff]] - 0xff) + index_of[c1[uVar7]];
              if (uVar8 < 0xff) {
                uVar1 = uVar8;
              }
              uVar8 = alpha_of[uVar1];
            }
          }
          uVar6 = uVar6 ^ uVar8;
          uVar7 = uVar7 + 1;
          uVar5 = uVar5 + uVar4;
        } while (c_len != uVar7);
        puVar3[uVar4 - 1] = uVar6;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 | 1));
  }
  return puVar3;
}

Assistant:

uint32_t *calculate_syndrome(uint32_t *c1, uint32_t c_len, uint32_t t, uint32_t *new_len)
{
    uint32_t len = 2 * t;
    if (new_len != NULL)
        *new_len = len;

    uint32_t *S = vector_new(len);
    for (uint32_t i = 1; i <= len; i++)
    {
        S[i - 1] = 0;
        for (uint32_t j = 0; j < c_len; j++)
            S[i - 1] = gf_sum(S[i - 1], gf_mul(c1[j], alpha_of[i * j % GFsize]));
    }

    return S;
}